

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_227fc::ChannelOut_pitchbend(lua_State *L)

{
  ChannelOut *this;
  ulong uVar1;
  
  this = getChannelOut(L,1);
  uVar1 = luaL_checkinteger(L,2);
  if (0x3fff < uVar1) {
    luaL_argerror(L,2,"Pitch bend position must be between 0 and 16383");
  }
  ChannelOut::send<int,long,long>
            (this,this->index + 0xe0,(ulong)((uint)uVar1 & 0x7f),(ulong)((uint)uVar1 >> 7 & 0x7f));
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_pitchbend(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 2, "Pitch bend position must be between 0 and 16383");

	self.send(0xE0 + self.index, value & 0x7Fu, (value >> 7) & 0x7Fu);
	lua_settop(L, 1);
	return 1;
}